

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

void __thiscall Ptex::v2_4::StringKey::StringKey(StringKey *this,char *val)

{
  uint32_t uVar1;
  size_t sVar2;
  char *in_RSI;
  undefined8 *in_RDI;
  int in_stack_0000003c;
  char *in_stack_00000040;
  
  *in_RDI = in_RSI;
  sVar2 = strlen(in_RSI);
  *(int *)(in_RDI + 1) = (int)sVar2;
  uVar1 = memHash(in_stack_00000040,in_stack_0000003c);
  *(uint32_t *)((long)in_RDI + 0xc) = uVar1;
  *(undefined1 *)(in_RDI + 2) = 0;
  return;
}

Assistant:

StringKey(const char* val)
    {
        _val = val;
        _len = uint32_t(strlen(val));
        _hash = memHash(_val, _len);
        _ownsVal = false;
    }